

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O1

bool __thiscall
Clasp::PBBuilder::addConstraint
          (PBBuilder *this,WeightLitVec *lits,weight_t bound,bool eq,weight_t cw)

{
  int iVar1;
  pointer ppVar2;
  bool bVar3;
  uint32 uVar4;
  Literal W;
  CPair CVar5;
  
  bVar3 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  W.rep_ = 0;
  if (bVar3) {
    if (0 < cw) {
      if ((lits->ebo_).size == 1) {
        ppVar2 = (lits->ebo_).buf;
        iVar1 = ppVar2->second;
        if (iVar1 < 0) {
          bound = bound - iVar1;
          ppVar2->second = -iVar1;
          (ppVar2->first).rep_ = (ppVar2->first).rep_ & 0xfffffffe ^ 2;
        }
        if (ppVar2->second < bound) {
          (ppVar2->first).rep_ = 2;
        }
        SharedContext::addMinimize
                  ((this->super_ProgramBuilder).ctx_,
                   (WeightLiteral)
                   ((ulong)(uint)cw << 0x20 | (ulong)((ppVar2->first).rep_ & 0xfffffffe) ^ 2),0);
        W.rep_ = 1;
        goto LAB_0015e07b;
      }
      uVar4 = getAuxVar(this);
      W.rep_ = uVar4 << 2;
      SharedContext::addMinimize
                ((this->super_ProgramBuilder).ctx_,(WeightLiteral)(CONCAT44(cw,W.rep_) + 2),0);
    }
    CVar5 = WeightConstraint::create
                      (*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf,W,lits,bound,
                       (uint)eq << 5);
    W.rep_ = (uint32)(CVar5.con[1] != (WeightConstraint *)0x1 &&
                     CVar5.con[0] != (WeightConstraint *)0x1);
  }
LAB_0015e07b:
  return SUB41(W.rep_,0);
}

Assistant:

bool PBBuilder::addConstraint(WeightLitVec& lits, weight_t bound, bool eq, weight_t cw) {
	if (!ctx()->ok()) { return false; }
	Var eqVar = 0;
	if (cw > 0) { // soft constraint
		if (lits.size() != 1) {
			eqVar = getAuxVar();
			addMinLit(0, WeightLiteral(negLit(eqVar), cw));
		}
		else {
			if (lits[0].second < 0)    { bound += (lits[0].second = -lits[0].second); lits[0].first = ~lits[0].first; }
			if (lits[0].second < bound){ lits[0].first = lit_false(); }
			addMinLit(0, WeightLiteral(~lits[0].first, cw));
			return true;
		}
	}
	return WeightConstraint::create(*ctx()->master(), posLit(eqVar), lits, bound, !eq ? 0 : WeightConstraint::create_eq_bound).ok();
}